

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O3

void __thiscall VertexAttrib64Bit::Base::LinkProgram(Base *this,GLuint id)

{
  ostringstream *this_00;
  TestLog *this_01;
  GLenum GVar1;
  MessageBuilder *this_02;
  TestError *this_03;
  GLint message_length;
  vector<char,_std::allocator<char>_> message;
  GLint status;
  GLint local_20c;
  vector<char,_std::allocator<char>_> local_208;
  string local_1f0;
  GLint local_1cc;
  string local_1c8;
  undefined1 local_1a8 [32];
  _Alloc_hider local_188;
  ios_base local_130 [264];
  
  local_1cc = 0;
  (*(this->gl).linkProgram)(id);
  GVar1 = (*(this->gl).getError)();
  glu::checkError(GVar1,"LinkProgram",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0xd7);
  (*(this->gl).getProgramiv)(id,0x8b82,&local_1cc);
  GVar1 = (*(this->gl).getError)();
  glu::checkError(GVar1,"GetProgramiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0xda);
  if (local_1cc != 0) {
    return;
  }
  local_20c = 0;
  local_208.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (GLchar *)0x0;
  local_208.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_208.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (*(this->gl).getProgramiv)(id,0x8b84,&local_20c);
  GVar1 = (*(this->gl).getError)();
  glu::checkError(GVar1,"GetProgramiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0xe2);
  std::vector<char,_std::allocator<char>_>::resize(&local_208,(long)(local_20c + 1));
  (*(this->gl).getProgramInfoLog)
            (id,local_20c,&local_20c,
             local_208.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start);
  GVar1 = (*(this->gl).getError)();
  glu::checkError(GVar1,"GetProgramInfoLog",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0xe7);
  this_01 = this->m_log;
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"Program link error","");
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,0x1af8059);
  tcu::LogSection::LogSection((LogSection *)local_1a8,&local_1f0,&local_1c8);
  tcu::TestLog::startSection(this_01,(char *)local_1a8._0_8_,local_188._M_p);
  tcu::LogSection::~LogSection((LogSection *)local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  local_1a8._0_8_ = this->m_log;
  this_00 = (ostringstream *)(local_1a8 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Link log:\n",10);
  local_1f0._M_dataplus._M_p =
       local_208.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_start;
  this_02 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1a8,(char **)&local_1f0);
  tcu::MessageBuilder::operator<<(this_02,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_130);
  tcu::TestLog::endSection(this->m_log);
  this_03 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_03,"Program linking failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
             ,0xef);
  __cxa_throw(this_03,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void Base::LinkProgram(GLuint id) const
{
	GLint status = 0;
	gl.linkProgram(id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "LinkProgram");

	gl.getProgramiv(id, GL_LINK_STATUS, &status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramiv");

	if (GL_FALSE == status)
	{
		GLint				message_length = 0;
		std::vector<GLchar> message;

		gl.getProgramiv(id, GL_INFO_LOG_LENGTH, &message_length);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramiv");

		message.resize(message_length + 1);

		gl.getProgramInfoLog(id, message_length, &message_length, &message[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramInfoLog");

		m_log << tcu::TestLog::Section("Program link error", "");

		m_log << tcu::TestLog::Message << "Link log:\n" << &message[0] << tcu::TestLog::EndMessage;

		m_log << tcu::TestLog::EndSection;

		TCU_FAIL("Program linking failed");
	}
}